

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_hmi_midiout.cpp
# Opt level: O3

void __thiscall HMISong::HMISong(HMISong *this,FileReader *reader,EMidiDevice type,char *args)

{
  int *piVar1;
  int iVar2;
  BYTE *pBVar3;
  undefined4 extraout_var;
  ulong uVar4;
  uint len;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  MIDIStreamer::MIDIStreamer(&this->super_MIDIStreamer,type,args);
  (this->super_MIDIStreamer).super_MusInfo._vptr_MusInfo = (_func_int **)&PTR__HMISong_006f0618;
  this->MusHeader = (BYTE *)0x0;
  this->Tracks = (TrackInfo *)0x0;
  (this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff> = (TArray<AutoNoteOff,_AutoNoteOff>)0x0;
  len = (uint)reader->Length;
  if (0xff < (int)len) {
    uVar4 = (ulong)(len & 0x7fffffff);
    pBVar3 = (BYTE *)operator_new__(uVar4);
    this->MusHeader = pBVar3;
    this->SongLen = len;
    this->NumTracks = 0;
    iVar2 = (*(reader->super_FileReaderBase)._vptr_FileReaderBase[2])(reader,pBVar3,uVar4);
    if (CONCAT44(extraout_var,iVar2) == uVar4) {
      piVar1 = (int *)this->MusHeader;
      auVar6[0] = -(*(char *)((long)piVar1 + 3) == '-');
      auVar6[1] = -((char)piVar1[1] == 'M');
      auVar6[2] = -(*(char *)((long)piVar1 + 5) == 'I');
      auVar6[3] = -(*(char *)((long)piVar1 + 6) == 'D');
      auVar6[4] = -(*(char *)((long)piVar1 + 7) == 'I');
      auVar6[5] = -((char)piVar1[2] == 'S');
      auVar6[6] = -(*(char *)((long)piVar1 + 9) == 'O');
      auVar6[7] = -(*(char *)((long)piVar1 + 10) == 'N');
      auVar6[8] = -(*(char *)((long)piVar1 + 0xb) == 'G');
      auVar6[9] = -((char)piVar1[3] == '0');
      auVar6[10] = -(*(char *)((long)piVar1 + 0xd) == '6');
      auVar6[0xb] = -(*(char *)((long)piVar1 + 0xe) == '1');
      auVar6[0xc] = -(*(char *)((long)piVar1 + 0xf) == '5');
      auVar6[0xd] = -((char)piVar1[4] == '9');
      auVar6[0xe] = -(*(char *)((long)piVar1 + 0x11) == '5');
      auVar6[0xf] = -(*(char *)((long)piVar1 + 0x12) == '\0');
      auVar5[0] = -((char)*piVar1 == 'H');
      auVar5[1] = -(*(char *)((long)piVar1 + 1) == 'M');
      auVar5[2] = -(*(char *)((long)piVar1 + 2) == 'I');
      auVar5[3] = -(*(char *)((long)piVar1 + 3) == '-');
      auVar5[4] = -((char)piVar1[1] == 'M');
      auVar5[5] = -(*(char *)((long)piVar1 + 5) == 'I');
      auVar5[6] = -(*(char *)((long)piVar1 + 6) == 'D');
      auVar5[7] = -(*(char *)((long)piVar1 + 7) == 'I');
      auVar5[8] = -((char)piVar1[2] == 'S');
      auVar5[9] = -(*(char *)((long)piVar1 + 9) == 'O');
      auVar5[10] = -(*(char *)((long)piVar1 + 10) == 'N');
      auVar5[0xb] = -(*(char *)((long)piVar1 + 0xb) == 'G');
      auVar5[0xc] = -((char)piVar1[3] == '0');
      auVar5[0xd] = -(*(char *)((long)piVar1 + 0xd) == '6');
      auVar5[0xe] = -(*(char *)((long)piVar1 + 0xe) == '1');
      auVar5[0xf] = -(*(char *)((long)piVar1 + 0xf) == '5');
      auVar5 = auVar5 & auVar6;
      if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar5[0xf] >> 7) << 0xf) == 0xffff) {
        SetupForHMI(this,len);
      }
      else if ((*piVar1 == 0x4d494d48) && (piVar1[1] == 0x50494449)) {
        SetupForHMP(this,len);
      }
    }
  }
  return;
}

Assistant:

HMISong::HMISong (FileReader &reader, EMidiDevice type, const char *args)
: MIDIStreamer(type, args), MusHeader(0), Tracks(0)
{
#ifdef _WIN32
	if (ExitEvent == NULL)
	{
		return;
	}
#endif
    int len = reader.GetLength();
	if (len < 0x100)
	{ // Way too small to be HMI.
		return;
	}
	MusHeader = new BYTE[len];
	SongLen = len;
	NumTracks = 0;
	if (reader.Read(MusHeader, len) != len)
		return;

	// Do some validation of the MIDI file
	if (memcmp(MusHeader, HMI_SONG_MAGIC, sizeof(HMI_SONG_MAGIC)) == 0)
	{
		SetupForHMI(len);
	}
	else if (((DWORD *)MusHeader)[0] == MAKE_ID('H','M','I','M') &&
			 ((DWORD *)MusHeader)[1] == MAKE_ID('I','D','I','P'))
	{
		SetupForHMP(len);
	}
}